

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O0

void __thiscall
ON_SubDEdgeIterator::Internal_Init
          (ON_SubDEdgeIterator *this,ON_SubDRef *subd_ref,uint edge_count,ON_SubDEdge *first,
          ON_SubDEdge *last,ON_SubDComponentPtr component_ptr)

{
  Type TVar1;
  ON_SubDComponentPtr *local_48;
  ON_SubDEdge *last_local;
  ON_SubDEdge *first_local;
  uint edge_count_local;
  ON_SubDRef *subd_ref_local;
  ON_SubDEdgeIterator *this_local;
  ON_SubDComponentPtr component_ptr_local;
  
  this_local = (ON_SubDEdgeIterator *)component_ptr.m_ptr;
  ON_SubDRef::operator=(&this->m_subd_ref,subd_ref);
  if (((first != (ON_SubDEdge *)0x0) && (last != (ON_SubDEdge *)0x0)) && (edge_count != 0)) {
    this->m_e_first = first;
    this->m_e_last = last;
    this->m_e_current = this->m_e_first;
    this->m_edge_count = edge_count;
    TVar1 = ON_SubDComponentPtr::ComponentType((ON_SubDComponentPtr *)&this_local);
    if (TVar1 == Unset) {
      local_48 = &ON_SubDComponentPtr::Null;
    }
    else {
      local_48 = (ON_SubDComponentPtr *)&this_local;
    }
    (this->m_component_ptr).m_ptr = (ON__UINT_PTR)local_48->m_ptr;
  }
  return;
}

Assistant:

void ON_SubDEdgeIterator::Internal_Init(
  const ON_SubDRef& subd_ref,
  unsigned int edge_count,
  const ON_SubDEdge* first,
  const ON_SubDEdge* last,
  ON_SubDComponentPtr component_ptr
)
{
  m_subd_ref = subd_ref;
  if (nullptr != first && nullptr != last && edge_count > 0)
  {
    m_e_first = first;
    m_e_last = last;
    m_e_current = m_e_first;
    m_edge_count = edge_count;
    m_component_ptr
      = (ON_SubDComponentPtr::Type::Unset == component_ptr.ComponentType())
      ? ON_SubDComponentPtr::Null
      : component_ptr;
  }
}